

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxMemberFunctionCall::FxMemberFunctionCall
          (FxMemberFunctionCall *this,FxExpression *self,FName *methodname,FArgumentList *args,
          FScriptPosition *pos)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_MemberFunctionCall,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxMemberFunctionCall_00706b00;
  (this->MethodName).Index = 0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression **)0x0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Most = 0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count = 0;
  this->Self = self;
  (this->MethodName).Index = methodname->Index;
  TArray<FxExpression_*,_FxExpression_*>::operator=
            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
             &args->super_TArray<FxExpression_*,_FxExpression_*>);
  return;
}

Assistant:

FxMemberFunctionCall::FxMemberFunctionCall(FxExpression *self, FName methodname, FArgumentList &args, const FScriptPosition &pos)
	: FxExpression(EFX_MemberFunctionCall, pos)
{
	Self = self;
	MethodName = methodname;
	ArgList = std::move(args);
}